

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O0

bool __thiscall
AllocationPolicyManager::RequestAlloc
          (AllocationPolicyManager *this,size_t byteCount,bool externalAlloc)

{
  AutoCriticalSection local_30;
  AutoCriticalSection auto_cs;
  bool externalAlloc_local;
  size_t byteCount_local;
  AllocationPolicyManager *this_local;
  
  auto_cs.cs._7_1_ = externalAlloc;
  if ((this->supportConcurrency & 1U) == 0) {
    this_local._7_1_ = RequestAllocImpl(this,byteCount,externalAlloc);
  }
  else {
    AutoCriticalSection::AutoCriticalSection(&local_30,&this->cs);
    this_local._7_1_ = RequestAllocImpl(this,byteCount,(bool)(auto_cs.cs._7_1_ & 1));
    AutoCriticalSection::~AutoCriticalSection(&local_30);
  }
  return this_local._7_1_;
}

Assistant:

bool RequestAlloc(DECLSPEC_GUARD_OVERFLOW size_t byteCount, bool externalAlloc = false)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            return RequestAllocImpl(byteCount, externalAlloc);
        }
        else
        {
            return RequestAllocImpl(byteCount, externalAlloc);
        }
    }